

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O1

bool InitEthernet(AmpIO *Board,uint eth_port)

{
  uint8_t uVar1;
  bool bVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  ostream *poVar6;
  char *pcVar7;
  uint32_t status;
  uint16_t regHigh;
  uint16_t regMid;
  uint16_t regLow;
  uint local_3c;
  uint16_t local_36;
  uint16_t local_34;
  uint16_t local_32;
  
  uVar4 = BoardIO::GetFirmwareVersion((BoardIO *)Board);
  if (uVar4 < 5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   No Ethernet controller, firmware version = ",0x2e);
    BoardIO::GetFirmwareVersion((BoardIO *)Board);
  }
  else {
    uVar5 = BoardIO::GetFpgaVersionMajor((BoardIO *)Board);
    if (1 < uVar5) {
      PrintEthernetStatus(Board);
      FpgaIO::WriteEthernetPhyReset(&Board->super_FpgaIO,eth_port);
      Amp1394_Sleep(*(double *)(&DAT_00120050 + (ulong)(uVar5 == 2) * 8));
      FpgaIO::ReadEthernetStatus(&Board->super_FpgaIO,&local_3c);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"   After reset, status = ",0x19);
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      if (uVar5 == 2) {
        if ((local_3c & 0x20000000) == 0) {
          pcVar7 = "   Ethernet V2 failed initialization";
LAB_0010765f:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar7,0x24);
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
          std::ostream::put(-0x20);
          std::ostream::flush();
          EthBasePort::PrintStatus((ostream *)&std::cout,local_3c);
          return false;
        }
        uVar3 = FpgaIO::ReadKSZ8851ChipID(&Board->super_FpgaIO);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"   Chip ID = ",0xd);
        *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        if ((uVar3 & 0xfff0) != 0x8870) {
          return false;
        }
        bVar2 = CheckEthernetV2(Board);
        if (!bVar2) {
LAB_00107815:
          PrintEthernetStatus(Board);
          return false;
        }
        FpgaIO::ReadKSZ8851Reg(&Board->super_FpgaIO,'\x10',&local_32);
        FpgaIO::ReadKSZ8851Reg(&Board->super_FpgaIO,'\x12',&local_34);
        FpgaIO::ReadKSZ8851Reg(&Board->super_FpgaIO,'\x14',&local_36);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"   MAC address = ",0x11);
        *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
             *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,":",1);
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::endl<char,std::char_traits<char>>(poVar6);
      }
      else if (uVar5 == 3) {
        uVar1 = FpgaIO::GetEthernetPortStatusV3(local_3c,eth_port);
        if (-1 < (char)uVar1) {
          pcVar7 = "   Ethernet V3 failed initialization";
          goto LAB_0010765f;
        }
        bVar2 = CheckEthernetV3(Board,eth_port);
        if (!bVar2) goto LAB_00107815;
      }
      Amp1394_Sleep(2.5);
      return true;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"   No Ethernet in FPGA V",0x18);
  }
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  return false;
}

Assistant:

bool InitEthernet(AmpIO &Board, unsigned int eth_port)
{
    if (Board.GetFirmwareVersion() < 5) {
        std::cout << "   No Ethernet controller, firmware version = " << Board.GetFirmwareVersion() << std::endl;
        return false;
    }

    unsigned int fpga_ver = Board.GetFpgaVersionMajor();
    if (fpga_ver < 2) {
        std::cout << "   No Ethernet in FPGA V" << fpga_ver << std::endl;
        return false;
    }
    PrintEthernetStatus(Board);

    // Reset the board
    Board.WriteEthernetPhyReset(eth_port);
    if (fpga_ver == 2) {
        // Wait 100 msec
        Amp1394_Sleep(0.1);
    }
    else {
        // Wait 500 msec
        Amp1394_Sleep(0.5);
    }

    // Read the status
    uint32_t status;
    Board.ReadEthernetStatus(status);
    std::cout << "   After reset, status = " << std::hex << ((fpga_ver == 2) ? (status>>16) : status) << std::endl;

    if (fpga_ver == 2) {
        if (!(status & FpgaIO::ETH_STAT_INIT_OK_V2)) {
            std::cout << "   Ethernet V2 failed initialization" << std::endl;
            EthBasePort::PrintStatus(std::cout, status);
            return false;
        }

        // Read the Chip ID (16-bit read)
        uint16_t chipID = Board.ReadKSZ8851ChipID();
        std::cout << "   Chip ID = " << std::hex << chipID << std::endl;
        if ((chipID&0xfff0) != 0x8870)
            return false;


        // Check that KSZ8851 registers are as expected
        if (!CheckEthernetV2(Board)) {
            PrintEthernetStatus(Board);
            return false;
        }

        // Display the MAC address
        uint16_t regLow, regMid, regHigh;
        Board.ReadKSZ8851Reg(0x10, regLow);   // MAC address low = 0x94nn (nn = board id)
        Board.ReadKSZ8851Reg(0x12, regMid);   // MAC address middle = 0xOE13
        Board.ReadKSZ8851Reg(0x14, regHigh);  // MAC address high = 0xFA61
        std::cout << "   MAC address = " << std::hex << regHigh << ":" << regMid << ":" << regLow << std::endl;
    }
    else if (fpga_ver == 3) {
        uint8_t portStatus = FpgaIO::GetEthernetPortStatusV3(status, eth_port);
        if (!(portStatus & FpgaIO::ETH_PORT_STAT_INIT_OK)) {
            std::cout << "   Ethernet V3 failed initialization" << std::endl;
            EthBasePort::PrintStatus(std::cout, status);
            return false;
        }

        // Check that RTL8211F registers are as expected
        if (!CheckEthernetV3(Board, eth_port)) {
            PrintEthernetStatus(Board);
            return false;
        }
    }

    // Wait 2.5 sec
    Amp1394_Sleep(2.5);
    return true;
}